

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * findlocal(lua_State *L,CallInfo *ci,int n,StkId *pos)

{
  byte bVar1;
  Proto *f;
  char *pcVar2;
  StkId pTVar3;
  uint uVar4;
  uint uVar5;
  CallInfo *pCVar6;
  
  if ((ci->callstatus & 2) == 0) {
    pTVar3 = ci->func + 1;
LAB_0010aadb:
    if (L->ci == ci) {
      pCVar6 = (CallInfo *)&L->top;
    }
    else {
      pCVar6 = ci->next;
    }
    if (n < 1) {
      return (char *)0x0;
    }
    if ((long)pCVar6->func - (long)pTVar3 >> 4 < (long)n) {
      return (char *)0x0;
    }
    pcVar2 = "(*temporary)";
  }
  else {
    if (n < 0) {
      uVar5 = -n;
      pTVar3 = ci->func;
      bVar1 = *(byte *)(*(long *)((pTVar3->value_).f + 0x18) + 10);
      uVar4 = (int)((ulong)((long)(ci->u).l.base - (long)pTVar3) >> 4) - (uint)bVar1;
      if (uVar4 == uVar5 || SBORROW4(uVar4,uVar5) != (int)(uVar4 + n) < 0) {
        return (char *)0x0;
      }
      pTVar3 = pTVar3 + (ulong)bVar1 + (ulong)uVar5;
      pcVar2 = "(*vararg)";
      goto LAB_0010ab41;
    }
    pTVar3 = (ci->u).l.base;
    f = *(Proto **)((ci->func->value_).f + 0x18);
    pcVar2 = luaF_getlocalname(f,n,(int)((ulong)((long)(ci->u).l.savedpc - (long)f->code) >> 2) + -1
                              );
    if (pcVar2 == (char *)0x0) goto LAB_0010aadb;
  }
  pTVar3 = pTVar3 + (long)n + -1;
LAB_0010ab41:
  *pos = pTVar3;
  return pcVar2;
}

Assistant:

static const char *findlocal(lua_State *L, CallInfo *ci, int n,
                             StkId *pos) {
    const char *name = NULL;
    StkId base;
    if (isLua(ci)) {
        if (n < 0)  /* access to vararg values? */
            return findvararg(ci, -n, pos);
        else {
            base = ci->u.l.base;
            name = luaF_getlocalname(ci_func(ci)->p, n, currentpc(ci));
        }
    } else
        base = ci->func + 1;
    if (name == NULL) {  /* no 'standard' name? */
        StkId limit = (ci == L->ci) ? L->top : ci->next->func;
        if (limit - base >= n && n > 0)  /* is 'n' inside 'ci' stack? */
            name = "(*temporary)";  /* generic name for any valid slot */
        else
            return NULL;  /* no name */
    }
    *pos = base + (n - 1);
    return name;
}